

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cc
# Opt level: O0

char * replaceChar(char *stri,char ch1,char ch2)

{
  undefined1 uVar1;
  ulong uVar2;
  ulong uVar3;
  char *pcVar4;
  undefined1 *puVar5;
  char *__src;
  undefined1 in_DL;
  char in_SIL;
  char *in_RDI;
  int i;
  string seq;
  allocator<char> *__a;
  undefined4 in_stack_ffffffffffffffb8;
  int iVar6;
  undefined4 in_stack_ffffffffffffffbc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  allocator<char> local_31;
  string local_30 [38];
  undefined1 local_a;
  char local_9;
  char *local_8;
  
  __a = &local_31;
  local_a = in_DL;
  local_9 = in_SIL;
  local_8 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffc0,
             (char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),__a);
  std::allocator<char>::~allocator(&local_31);
  iVar6 = 0;
  while( true ) {
    uVar2 = (ulong)iVar6;
    uVar3 = std::__cxx11::string::length();
    pcVar4 = local_8;
    if (uVar3 <= uVar2) break;
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_30);
    uVar1 = local_a;
    if (*pcVar4 == local_9) {
      puVar5 = (undefined1 *)std::__cxx11::string::operator[]((ulong)local_30);
      *puVar5 = uVar1;
    }
    iVar6 = iVar6 + 1;
  }
  __src = (char *)std::__cxx11::string::c_str();
  strcpy(pcVar4,__src);
  std::__cxx11::string::~string(local_30);
  return local_8;
}

Assistant:

char* replaceChar(char *stri, char ch1, char ch2) {
    std::string seq(stri);
    // cout << seq.length() << endl;
    for (int i = 0; i < seq.length(); ++i) {
        if (seq[i] == ch1)
            seq[i] = ch2;
    }
    // char output[seq.length()+1];
    strcpy(stri, seq.c_str());
    return stri;
}